

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDistributionElementType::~IfcDistributionElementType
          (IfcDistributionElementType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x8a1248;
  *(undefined8 *)&(this->super_IfcElementType).field_0x190 = 0x8a1310;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x88 =
       0x8a1270;
  (this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8a1298;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 =
       0x8a12c0;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x148 = 0x8a12e8;
  puVar1 = *(undefined1 **)&(this->super_IfcElementType).super_IfcTypeProduct.field_0x158;
  if (puVar1 != &(this->super_IfcElementType).field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008a1108);
  operator_delete(this);
  return;
}

Assistant:

IfcDistributionElementType() : Object("IfcDistributionElementType") {}